

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.hpp
# Opt level: O1

void __thiscall
jsoncons::basic_json_reader<wchar_t,_jsoncons::string_source<wchar_t>,_std::allocator<char>_>::
read_next(basic_json_reader<wchar_t,_jsoncons::string_source<wchar_t>,_std::allocator<char>_> *this,
         error_code *ec)

{
  basic_json_parser<wchar_t,_std::allocator<char>_> *this_00;
  parse_state pVar1;
  int iVar2;
  value_type_conflict2 *pvVar3;
  char_type_conflict *pcVar4;
  char_type_conflict *pcVar5;
  value_type_conflict2 *data;
  value_type_conflict2 *pvVar6;
  long lVar7;
  char cVar8;
  
  this_00 = &this->parser_;
  basic_json_parser<wchar_t,_std::allocator<char>_>::reset(this_00);
  do {
    if ((this->parser_).more_ != true) goto LAB_005ac333;
    if ((this->parser_).input_ptr_ == (this->parser_).end_input_) {
      pvVar6 = (this->source_).source_.current_;
      pvVar3 = (this->source_).source_.end_;
      if (pvVar6 == pvVar3) {
        lVar7 = 0;
        pvVar6 = (value_type_conflict2 *)0x0;
      }
      else {
        lVar7 = (long)pvVar3 - (long)pvVar6 >> 2;
        (this->source_).source_.current_ = pvVar3;
        if ((this->source_).bof_ == true) {
          (this->source_).bof_ = false;
        }
      }
      iVar2 = ec->_M_value;
      if ((iVar2 == 0) && (lVar7 != 0)) {
        (this->parser_).begin_input_ = pvVar6;
        (this->parser_).end_input_ = pvVar6 + lVar7;
        (this->parser_).input_ptr_ = pvVar6;
      }
      if (iVar2 != 0) {
        return;
      }
    }
    pcVar4 = (this->parser_).input_ptr_;
    pcVar5 = (this->parser_).end_input_;
    basic_json_parser<wchar_t,_std::allocator<char>_>::parse_some_(this_00,this->visitor_,ec);
    cVar8 = ec->_M_value != 0;
    if (pcVar4 == pcVar5 && !(bool)cVar8) {
      pVar1 = (this->parser_).state_;
      cVar8 = '\x03';
      if (pVar1 != start) {
        cVar8 = '\0';
        if ((pVar1 != accept) && (cVar8 = '\0', ((this->parser_).done_ & 1U) == 0)) {
          cVar8 = '\x01';
          std::error_code::operator=(ec,unexpected_eof);
        }
      }
    }
  } while (cVar8 == '\0');
  if (cVar8 != '\x01') {
LAB_005ac333:
    basic_json_parser<wchar_t,_std::allocator<char>_>::skip_whitespace(this_00);
    do {
      if ((this->source_).source_.current_ == (this->source_).source_.end_) {
        return;
      }
      basic_json_parser<wchar_t,_std::allocator<char>_>::skip_whitespace(this_00);
      if ((this->parser_).input_ptr_ != (this->parser_).end_input_) {
        return;
      }
      pvVar6 = (this->source_).source_.current_;
      pvVar3 = (this->source_).source_.end_;
      if (pvVar6 == pvVar3) {
        lVar7 = 0;
        pvVar6 = (value_type_conflict2 *)0x0;
      }
      else {
        lVar7 = (long)pvVar3 - (long)pvVar6 >> 2;
        (this->source_).source_.current_ = pvVar3;
        if ((this->source_).bof_ == true) {
          (this->source_).bof_ = false;
        }
      }
      iVar2 = ec->_M_value;
      if ((iVar2 == 0) && (lVar7 != 0)) {
        (this->parser_).begin_input_ = pvVar6;
        (this->parser_).end_input_ = pvVar6 + lVar7;
        (this->parser_).input_ptr_ = pvVar6;
      }
    } while (iVar2 == 0);
  }
  return;
}

Assistant:

void read_next(std::error_code& ec)
        {
            if (source_.is_error())
            {
                ec = json_errc::source_error;
                return;
            }        
            parser_.reset();
            while (!parser_.stopped())
            {
                if (parser_.source_exhausted())
                {
                    auto s = source_.read_buffer(ec);
                    if (JSONCONS_UNLIKELY(ec)) return;
                    if (s.size() > 0)
                    {
                        parser_.update(s.data(),s.size());
                    }
                }
                bool eof = parser_.source_exhausted();
                parser_.parse_some(visitor_, ec);
                if (JSONCONS_UNLIKELY(ec)) return;
                if (eof)
                {
                    if (parser_.enter())
                    {
                        break;
                    }
                    else if (!parser_.accept())
                    {
                        ec = json_errc::unexpected_eof;
                        return;
                    }
                }
            }
            
            parser_.skip_whitespace();
            while (!source_.eof())
            {
                parser_.skip_whitespace();
                if (parser_.source_exhausted())
                {
                    auto s = source_.read_buffer(ec);
                    if (JSONCONS_UNLIKELY(ec)) return;
                    if (s.size() > 0)
                    {
                        parser_.update(s.data(),s.size());
                    }
                }
                else
                {
                    break;
                }
            }
        }